

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O0

bin_mdef_t * bin_mdef_read(ps_config_t *config,char *filename)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  mmio_file_t *pmVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  uint *puVar9;
  _IO_marker *p_Var10;
  _IO_FILE *p_Var11;
  bool bVar12;
  uint local_a4;
  uint local_9c;
  uint local_98;
  int local_7c;
  int ci;
  int s;
  int32 ssid;
  int32 j;
  int32 *sseq_size;
  long end;
  long pos;
  int32 swap;
  int32 do_mmap;
  int32 i;
  int32 val;
  size_t tree_start;
  FILE *fh;
  bin_mdef_t *m;
  char *filename_local;
  ps_config_t *config_local;
  
  m = (bin_mdef_t *)filename;
  filename_local = (char *)config;
  fh = (FILE *)bin_mdef_read_text(config,filename);
  config_local = (ps_config_t *)fh;
  if (fh == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
            ,0x150,"Reading binary model definition: %s\n",m);
    tree_start = (size_t)fopen((char *)m,"rb");
    if ((FILE *)tree_start == (FILE *)0x0) {
      config_local = (ps_config_t *)0x0;
    }
    else {
      sVar3 = fread(&do_mmap,4,1,(FILE *)tree_start);
      if (sVar3 == 1) {
        bVar12 = do_mmap == 0x424d4446;
        if (bVar12) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                  ,0x15d,"Must byte-swap %s\n",m);
        }
        sVar3 = fread(&do_mmap,4,1,(FILE *)tree_start);
        if (sVar3 == 1) {
          if (bVar12) {
            do_mmap = do_mmap >> 0x18 & 0xffU | do_mmap >> 8 & 0xff00U | (do_mmap & 0xff00U) << 8 |
                      do_mmap << 0x18;
          }
          if (do_mmap < 2) {
            sVar3 = fread(&do_mmap,4,1,(FILE *)tree_start);
            if (sVar3 == 1) {
              if (bVar12) {
                do_mmap = do_mmap >> 0x18 & 0xffU | do_mmap >> 8 & 0xff00U |
                          (do_mmap & 0xff00U) << 8 | do_mmap << 0x18;
              }
              fseek((FILE *)tree_start,(long)do_mmap,1);
              fh = (FILE *)__ckd_calloc__(1,0x78,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                          ,0x177);
              fh->_flags = 1;
              sVar3 = fread(&fh->field_0x4,4,1,(FILE *)tree_start);
              if (sVar3 == 1) {
                if (bVar12) {
                  *(uint *)&fh->field_0x4 =
                       *(int *)&fh->field_0x4 >> 0x18 & 0xffU |
                       *(int *)&fh->field_0x4 >> 8 & 0xff00U |
                       (*(uint *)&fh->field_0x4 & 0xff00) << 8 | *(int *)&fh->field_0x4 << 0x18;
                }
                sVar3 = fread(&fh->_IO_read_ptr,4,1,(FILE *)tree_start);
                if (sVar3 == 1) {
                  if (bVar12) {
                    *(uint *)&fh->_IO_read_ptr =
                         *(int *)&fh->_IO_read_ptr >> 0x18 & 0xffU |
                         *(int *)&fh->_IO_read_ptr >> 8 & 0xff00U |
                         (*(uint *)&fh->_IO_read_ptr & 0xff00) << 8 |
                         *(int *)&fh->_IO_read_ptr << 0x18;
                  }
                  sVar3 = fread((void *)((long)&fh->_IO_read_ptr + 4),4,1,(FILE *)tree_start);
                  if (sVar3 == 1) {
                    if (bVar12) {
                      *(uint *)((long)&fh->_IO_read_ptr + 4) =
                           *(int *)((long)&fh->_IO_read_ptr + 4) >> 0x18 & 0xffU |
                           *(int *)((long)&fh->_IO_read_ptr + 4) >> 8 & 0xff00U |
                           (*(uint *)((long)&fh->_IO_read_ptr + 4) & 0xff00) << 8 |
                           *(int *)((long)&fh->_IO_read_ptr + 4) << 0x18;
                    }
                    sVar3 = fread(&fh->_IO_read_end,4,1,(FILE *)tree_start);
                    if (sVar3 == 1) {
                      if (bVar12) {
                        *(uint *)&fh->_IO_read_end =
                             *(int *)&fh->_IO_read_end >> 0x18 & 0xffU |
                             *(int *)&fh->_IO_read_end >> 8 & 0xff00U |
                             (*(uint *)&fh->_IO_read_end & 0xff00) << 8 |
                             *(int *)&fh->_IO_read_end << 0x18;
                      }
                      sVar3 = fread((void *)((long)&fh->_IO_read_end + 4),4,1,(FILE *)tree_start);
                      if (sVar3 == 1) {
                        if (bVar12) {
                          *(uint *)((long)&fh->_IO_read_end + 4) =
                               *(int *)((long)&fh->_IO_read_end + 4) >> 0x18 & 0xffU |
                               *(int *)((long)&fh->_IO_read_end + 4) >> 8 & 0xff00U |
                               (*(uint *)((long)&fh->_IO_read_end + 4) & 0xff00) << 8 |
                               *(int *)((long)&fh->_IO_read_end + 4) << 0x18;
                        }
                        sVar3 = fread(&fh->_IO_read_base,4,1,(FILE *)tree_start);
                        if (sVar3 == 1) {
                          if (bVar12) {
                            *(uint *)&fh->_IO_read_base =
                                 *(int *)&fh->_IO_read_base >> 0x18 & 0xffU |
                                 *(int *)&fh->_IO_read_base >> 8 & 0xff00U |
                                 (*(uint *)&fh->_IO_read_base & 0xff00) << 8 |
                                 *(int *)&fh->_IO_read_base << 0x18;
                          }
                          sVar3 = fread((void *)((long)&fh->_IO_read_base + 4),4,1,
                                        (FILE *)tree_start);
                          if (sVar3 == 1) {
                            if (bVar12) {
                              *(uint *)((long)&fh->_IO_read_base + 4) =
                                   *(int *)((long)&fh->_IO_read_base + 4) >> 0x18 & 0xffU |
                                   *(int *)((long)&fh->_IO_read_base + 4) >> 8 & 0xff00U |
                                   (*(uint *)((long)&fh->_IO_read_base + 4) & 0xff00) << 8 |
                                   *(int *)((long)&fh->_IO_read_base + 4) << 0x18;
                            }
                            sVar3 = fread(&fh->_IO_write_base,4,1,(FILE *)tree_start);
                            if (sVar3 == 1) {
                              if (bVar12) {
                                *(uint *)&fh->_IO_write_base =
                                     *(int *)&fh->_IO_write_base >> 0x18 & 0xffU |
                                     *(int *)&fh->_IO_write_base >> 8 & 0xff00U |
                                     (*(uint *)&fh->_IO_write_base & 0xff00) << 8 |
                                     *(int *)&fh->_IO_write_base << 0x18;
                              }
                              sVar3 = fread((void *)((long)&fh->_IO_write_base + 4),4,1,
                                            (FILE *)tree_start);
                              if (sVar3 == 1) {
                                if (bVar12) {
                                  *(uint *)((long)&fh->_IO_write_base + 4) =
                                       *(int *)((long)&fh->_IO_write_base + 4) >> 0x18 & 0xffU |
                                       *(int *)((long)&fh->_IO_write_base + 4) >> 8 & 0xff00U |
                                       (*(uint *)((long)&fh->_IO_write_base + 4) & 0xff00) << 8 |
                                       *(int *)((long)&fh->_IO_write_base + 4) << 0x18;
                                }
                                sVar3 = fread(&fh->_IO_write_ptr,4,1,(FILE *)tree_start);
                                if (sVar3 == 1) {
                                  if (bVar12) {
                                    *(uint *)&fh->_IO_write_ptr =
                                         *(int *)&fh->_IO_write_ptr >> 0x18 & 0xffU |
                                         *(int *)&fh->_IO_write_ptr >> 8 & 0xff00U |
                                         (*(uint *)&fh->_IO_write_ptr & 0xff00) << 8 |
                                         *(int *)&fh->_IO_write_ptr << 0x18;
                                  }
                                  pcVar4 = (char *)__ckd_calloc__((long)*(int *)&fh->field_0x4,8,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,400);
                                  fh->_IO_buf_base = pcVar4;
                                  if (filename_local == (char *)0x0) {
                                    local_7c = 1;
                                  }
                                  else {
                                    local_7c = ps_config_bool((ps_config_t *)filename_local,"mmap");
                                  }
                                  pos._4_4_ = local_7c;
                                  if (bVar12) {
                                    err_msg(ERR_WARN,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                            ,0x195,
                                            "-mmap specified, but mdef is other-endian.  Will not memory-map.\n"
                                           );
                                    pos._4_4_ = 0;
                                  }
                                  if (pos._4_4_ != 0) {
                                    pmVar5 = mmio_file_read((char *)m);
                                    fh->_IO_write_end = (char *)pmVar5;
                                    if (fh->_IO_write_end == (char *)0x0) {
                                      pos._4_4_ = 0;
                                    }
                                  }
                                  lVar6 = ftell((FILE *)tree_start);
                                  if (pos._4_4_ == 0) {
                                    fh->_fileno = 1;
                                    fseek((FILE *)tree_start,0,2);
                                    lVar8 = ftell((FILE *)tree_start);
                                    fseek((FILE *)tree_start,lVar6,0);
                                    pvVar7 = __ckd_malloc__(lVar8 - lVar6,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1ab);
                                    *(void **)fh->_IO_buf_base = pvVar7;
                                    sVar3 = fread(*(void **)fh->_IO_buf_base,1,lVar8 - lVar6,
                                                  (FILE *)tree_start);
                                    if (sVar3 != lVar8 - lVar6) {
                                      err_msg(ERR_FATAL,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                              ,0x1ad,"Failed to read %d bytes of data from %s\n",
                                              lVar8 - lVar6,m);
                                      exit(1);
                                    }
                                  }
                                  else {
                                    pvVar7 = mmio_file_ptr((mmio_file_t *)fh->_IO_write_end);
                                    *(long *)fh->_IO_buf_base = (long)pvVar7 + lVar6;
                                    fh->_fileno = 2;
                                  }
                                  for (swap = 1; swap < *(int *)&fh->field_0x4; swap = swap + 1) {
                                    lVar6 = *(long *)(fh->_IO_buf_base + (long)(swap + -1) * 8);
                                    sVar3 = strlen(*(char **)(fh->_IO_buf_base +
                                                             (long)(swap + -1) * 8));
                                    *(size_t *)(fh->_IO_buf_base + (long)swap * 8) =
                                         lVar6 + sVar3 + 1;
                                  }
                                  lVar6 = *(long *)(fh->_IO_buf_base + (long)(swap + -1) * 8);
                                  sVar3 = strlen(*(char **)(fh->_IO_buf_base + (long)(swap + -1) * 8
                                                           ));
                                  _i = ((lVar6 + sVar3) - *(long *)fh->_IO_buf_base) + 4 &
                                       0xfffffffffffffffc;
                                  fh->_IO_buf_end = (char *)(*(long *)fh->_IO_buf_base + _i);
                                  if (bVar12) {
                                    for (swap = 0; swap < *(int *)((long)&fh->_IO_write_base + 4);
                                        swap = swap + 1) {
                                      *(ushort *)(fh->_IO_buf_end + (long)swap * 8) =
                                           *(ushort *)(fh->_IO_buf_end + (long)swap * 8) >> 8 |
                                           *(short *)(fh->_IO_buf_end + (long)swap * 8) << 8;
                                      *(ushort *)(fh->_IO_buf_end + (long)swap * 8 + 2) =
                                           *(ushort *)(fh->_IO_buf_end + (long)swap * 8 + 2) >> 8 |
                                           *(short *)(fh->_IO_buf_end + (long)swap * 8 + 2) << 8;
                                      *(uint *)(fh->_IO_buf_end + (long)swap * 8 + 4) =
                                           *(int *)(fh->_IO_buf_end + (long)swap * 8 + 4) >> 0x18 &
                                           0xffU | *(int *)(fh->_IO_buf_end + (long)swap * 8 + 4) >>
                                                   8 & 0xff00U |
                                           (*(uint *)(fh->_IO_buf_end + (long)swap * 8 + 4) & 0xff00
                                           ) << 8 | *(int *)(fh->_IO_buf_end + (long)swap * 8 + 4)
                                                    << 0x18;
                                    }
                                  }
                                  fh->_IO_save_base =
                                       fh->_IO_buf_end +
                                       (long)*(int *)((long)&fh->_IO_write_base + 4) * 8;
                                  if (bVar12) {
                                    for (swap = 0; swap < *(int *)&fh->_IO_read_ptr; swap = swap + 1
                                        ) {
                                      *(uint *)(fh->_IO_save_base + (long)swap * 0xc) =
                                           *(int *)(fh->_IO_save_base + (long)swap * 0xc) >> 0x18 &
                                           0xffU | *(int *)(fh->_IO_save_base + (long)swap * 0xc) >>
                                                   8 & 0xff00U |
                                           (*(uint *)(fh->_IO_save_base + (long)swap * 0xc) & 0xff00
                                           ) << 8 | *(int *)(fh->_IO_save_base + (long)swap * 0xc)
                                                    << 0x18;
                                      *(uint *)(fh->_IO_save_base + (long)swap * 0xc + 4) =
                                           *(int *)(fh->_IO_save_base + (long)swap * 0xc + 4) >>
                                           0x18 & 0xffU |
                                           *(int *)(fh->_IO_save_base + (long)swap * 0xc + 4) >> 8 &
                                           0xff00U | (*(uint *)(fh->_IO_save_base +
                                                               (long)swap * 0xc + 4) & 0xff00) << 8
                                           | *(int *)(fh->_IO_save_base + (long)swap * 0xc + 4) <<
                                             0x18;
                                    }
                                  }
                                  puVar9 = (uint *)(fh->_IO_save_base +
                                                   (long)*(int *)&fh->_IO_read_ptr * 0xc);
                                  if (bVar12) {
                                    *puVar9 = (int)*puVar9 >> 0x18 & 0xffU |
                                              (int)*puVar9 >> 8 & 0xff00U | (*puVar9 & 0xff00) << 8
                                              | *puVar9 << 0x18;
                                  }
                                  pcVar4 = (char *)__ckd_calloc__((long)*(int *)((long)&fh->
                                                  _IO_read_base + 4),8,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1c9);
                                  fh->_IO_backup_base = pcVar4;
                                  *(uint **)fh->_IO_backup_base = puVar9 + 1;
                                  if (bVar12) {
                                    for (swap = 0; swap < (int)*puVar9; swap = swap + 1) {
                                      *(ushort *)(*(long *)fh->_IO_backup_base + (long)swap * 2) =
                                           *(ushort *)
                                            (*(long *)fh->_IO_backup_base + (long)swap * 2) >> 8 |
                                           *(short *)(*(long *)fh->_IO_backup_base + (long)swap * 2)
                                           << 8;
                                    }
                                  }
                                  if (*(int *)((long)&fh->_IO_read_ptr + 4) == 0) {
                                    fh->_IO_save_end =
                                         (char *)(*(long *)fh->_IO_backup_base +
                                                 (long)(int)*puVar9 * 2);
                                    for (swap = 1; swap < *(int *)((long)&fh->_IO_read_base + 4);
                                        swap = swap + 1) {
                                      *(long *)(fh->_IO_backup_base + (long)swap * 8) =
                                           *(long *)(fh->_IO_backup_base + (long)(swap + -1) * 8) +
                                           (long)(int)(uint)(byte)fh->_IO_save_end[swap + -1] * 2;
                                    }
                                  }
                                  else {
                                    for (swap = 1; swap < *(int *)((long)&fh->_IO_read_base + 4);
                                        swap = swap + 1) {
                                      *(long *)(fh->_IO_backup_base + (long)swap * 8) =
                                           *(long *)fh->_IO_backup_base +
                                           (long)(swap * *(int *)((long)&fh->_IO_read_ptr + 4)) * 2;
                                    }
                                  }
                                  p_Var10 = (_IO_marker *)
                                            __ckd_malloc__((long)*(int *)((long)&fh->_IO_read_end +
                                                                         4) << 1,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1dd);
                                  fh->_markers = p_Var10;
                                  p_Var11 = (_IO_FILE *)
                                            __ckd_malloc__((long)*(int *)((long)&fh->_IO_read_end +
                                                                         4) << 1,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                  ,0x1de);
                                  fh->_chain = p_Var11;
                                  for (swap = 0; swap < *(int *)&fh->_IO_read_end; swap = swap + 1)
                                  {
                                    *(short *)(fh->_markers + (long)swap * 2) = (short)swap;
                                  }
                                  for (; swap < *(int *)((long)&fh->_IO_read_end + 4);
                                      swap = swap + 1) {
                                    *(undefined2 *)(fh->_markers + (long)swap * 2) = 0xffff;
                                  }
                                  for (swap = 0; swap < *(int *)((long)&fh->_IO_read_end + 4);
                                      swap = swap + 1) {
                                    *(undefined2 *)((long)&fh->_chain->_flags + (long)swap * 2) =
                                         0xffff;
                                  }
                                  for (swap = 0; swap < *(int *)&fh->_IO_read_ptr; swap = swap + 1)
                                  {
                                    iVar2 = *(int *)(fh->_IO_save_base + (long)swap * 0xc);
                                    s = 0;
                                    while( true ) {
                                      if (*(int *)((long)&fh->_IO_read_ptr + 4) == 0) {
                                        local_98 = (uint)(byte)fh->_IO_save_end
                                                               [*(int *)(fh->_IO_save_base +
                                                                        (long)swap * 0xc)];
                                      }
                                      else {
                                        local_98 = *(uint *)((long)&fh->_IO_read_ptr + 4);
                                      }
                                      if ((int)local_98 <= s) break;
                                      uVar1 = (uint)*(ushort *)
                                                     (*(long *)(fh->_IO_backup_base +
                                                               (long)iVar2 * 8) + (long)s * 2);
                                      if (swap < *(int *)&fh->field_0x4) {
                                        local_9c = swap;
                                      }
                                      else {
                                        local_9c = (uint)(byte)fh->_IO_save_base
                                                               [(long)swap * 0xc + 9];
                                      }
                                      if (*(short *)((long)&fh->_chain->_flags +
                                                    (long)(int)uVar1 * 2) == -1) {
                                        *(short *)((long)&fh->_chain->_flags + (long)(int)uVar1 * 2)
                                             = (short)local_9c;
                                      }
                                      if ((int)*(short *)((long)&fh->_chain->_flags +
                                                         (long)(int)uVar1 * 2) != local_9c) {
                                        err_msg(ERR_WARN,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                ,499,
                                                "Senone %d is shared between multiple base phones\n"
                                                ,(ulong)uVar1);
                                      }
                                      if (*(int *)((long)&fh->_IO_read_ptr + 4) == 0) {
                                        local_a4 = (uint)(byte)fh->_IO_save_end
                                                               [*(int *)(fh->_IO_save_base +
                                                                        (long)(int)local_9c * 0xc)];
                                      }
                                      else {
                                        local_a4 = *(uint *)((long)&fh->_IO_read_ptr + 4);
                                      }
                                      if ((int)local_a4 < s) {
                                        err_msg(ERR_WARN,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                ,0x1f7,
                                                "CD phone %d has fewer states than CI phone %d\n",
                                                (ulong)(uint)swap,(ulong)local_9c);
                                      }
                                      else {
                                        *(undefined2 *)(fh->_markers + (long)(int)uVar1 * 2) =
                                             *(undefined2 *)
                                              (*(long *)(fh->_IO_backup_base +
                                                        (long)*(int *)(fh->_IO_save_base +
                                                                      (long)(int)local_9c * 0xc) * 8
                                                        ) + (long)s * 2);
                                      }
                                      s = s + 1;
                                    }
                                  }
                                  iVar2 = bin_mdef_ciphone_id((bin_mdef_t *)fh,"SIL");
                                  *(int *)&fh->_IO_write_ptr = iVar2;
                                  err_msg(ERR_INFO,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                          ,0x204,
                                          "%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n"
                                          ,(ulong)*(uint *)&fh->field_0x4,
                                          (ulong)(uint)(*(int *)&fh->_IO_read_ptr -
                                                       *(int *)&fh->field_0x4),
                                          *(undefined4 *)((long)&fh->_IO_read_ptr + 4),
                                          *(undefined4 *)&fh->_IO_read_end,
                                          *(undefined4 *)((long)&fh->_IO_read_end + 4),
                                          *(undefined4 *)((long)&fh->_IO_read_base + 4));
                                  fclose((FILE *)tree_start);
                                  config_local = (ps_config_t *)fh;
                                }
                                else {
                                  fclose((FILE *)tree_start);
                                  ckd_free(fh);
                                  err_msg_system(ERR_ERROR,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                                 ,0x18d,"Failed to read %s from %s\n","&m->sil",m);
                                  config_local = (ps_config_t *)0x0;
                                }
                              }
                              else {
                                fclose((FILE *)tree_start);
                                ckd_free(fh);
                                err_msg_system(ERR_ERROR,
                                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                               ,0x18c,"Failed to read %s from %s\n","&m->n_cd_tree",
                                               m);
                                config_local = (ps_config_t *)0x0;
                              }
                            }
                            else {
                              fclose((FILE *)tree_start);
                              ckd_free(fh);
                              err_msg_system(ERR_ERROR,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                             ,0x18b,"Failed to read %s from %s\n","&m->n_ctx",m);
                              config_local = (ps_config_t *)0x0;
                            }
                          }
                          else {
                            fclose((FILE *)tree_start);
                            ckd_free(fh);
                            err_msg_system(ERR_ERROR,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                           ,0x18a,"Failed to read %s from %s\n","&m->n_sseq",m);
                            config_local = (ps_config_t *)0x0;
                          }
                        }
                        else {
                          fclose((FILE *)tree_start);
                          ckd_free(fh);
                          err_msg_system(ERR_ERROR,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                         ,0x189,"Failed to read %s from %s\n","&m->n_tmat",m);
                          config_local = (ps_config_t *)0x0;
                        }
                      }
                      else {
                        fclose((FILE *)tree_start);
                        ckd_free(fh);
                        err_msg_system(ERR_ERROR,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                       ,0x188,"Failed to read %s from %s\n","&m->n_sen",m);
                        config_local = (ps_config_t *)0x0;
                      }
                    }
                    else {
                      fclose((FILE *)tree_start);
                      ckd_free(fh);
                      err_msg_system(ERR_ERROR,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                     ,0x187,"Failed to read %s from %s\n","&m->n_ci_sen",m);
                      config_local = (ps_config_t *)0x0;
                    }
                  }
                  else {
                    fclose((FILE *)tree_start);
                    ckd_free(fh);
                    err_msg_system(ERR_ERROR,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                   ,0x186,"Failed to read %s from %s\n","&m->n_emit_state",m);
                    config_local = (ps_config_t *)0x0;
                  }
                }
                else {
                  fclose((FILE *)tree_start);
                  ckd_free(fh);
                  err_msg_system(ERR_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                 ,0x185,"Failed to read %s from %s\n","&m->n_phone",m);
                  config_local = (ps_config_t *)0x0;
                }
              }
              else {
                fclose((FILE *)tree_start);
                ckd_free(fh);
                err_msg_system(ERR_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                               ,0x184,"Failed to read %s from %s\n","&m->n_ciphone",m);
                config_local = (ps_config_t *)0x0;
              }
            }
            else {
              fclose((FILE *)tree_start);
              err_msg_system(ERR_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                             ,0x16e,"Failed to read header length from %s\n",m);
              config_local = (ps_config_t *)0x0;
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                    ,0x168,"File format version %d for %s is newer than library\n",
                    (ulong)(uint)do_mmap,m);
            fclose((FILE *)tree_start);
            config_local = (ps_config_t *)0x0;
          }
        }
        else {
          fclose((FILE *)tree_start);
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                         ,0x161,"Failed to read version from %s\n",m);
          config_local = (ps_config_t *)0x0;
        }
      }
      else {
        fclose((FILE *)tree_start);
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                       ,0x157,"Failed to read byte-order marker from %s\n",m);
        config_local = (ps_config_t *)0x0;
      }
    }
  }
  return (bin_mdef_t *)config_local;
}

Assistant:

bin_mdef_t *
bin_mdef_read(ps_config_t *config, const char *filename)
{
    bin_mdef_t *m;
    FILE *fh;
    size_t tree_start;
    int32 val, i, do_mmap, swap;
    long pos, end;
    int32 *sseq_size;

    /* Try to read it as text first. */
    if ((m = bin_mdef_read_text(config, filename)) != NULL)
        return m;

    E_INFO("Reading binary model definition: %s\n", filename);
    if ((fh = fopen(filename, "rb")) == NULL)
        return NULL;

    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read byte-order marker from %s\n",
                       filename);
        return NULL;
    }
    swap = 0;
    if (val == BIN_MDEF_OTHER_ENDIAN) {
        swap = 1;
        E_INFO("Must byte-swap %s\n", filename);
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read version from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    if (val > BIN_MDEF_FORMAT_VERSION) {
        E_ERROR("File format version %d for %s is newer than library\n",
                val, filename);
        fclose(fh);
        return NULL;
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read header length from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    /* Skip format descriptor. */
    fseek(fh, val, SEEK_CUR);

    /* Finally allocate it. */
    m = ckd_calloc(1, sizeof(*m));
    m->refcnt = 1;

    /* Check these, to make gcc/glibc shut up. */
#define FREAD_SWAP32_CHK(dest)                                          \
    if (fread((dest), 4, 1, fh) != 1) {                                 \
        fclose(fh);                                                     \
        ckd_free(m);                                                    \
        E_ERROR_SYSTEM("Failed to read %s from %s\n", #dest, filename); \
        return NULL;                                                    \
    }                                                                   \
    if (swap) SWAP_INT32(dest);
    
    FREAD_SWAP32_CHK(&m->n_ciphone);
    FREAD_SWAP32_CHK(&m->n_phone);
    FREAD_SWAP32_CHK(&m->n_emit_state);
    FREAD_SWAP32_CHK(&m->n_ci_sen);
    FREAD_SWAP32_CHK(&m->n_sen);
    FREAD_SWAP32_CHK(&m->n_tmat);
    FREAD_SWAP32_CHK(&m->n_sseq);
    FREAD_SWAP32_CHK(&m->n_ctx);
    FREAD_SWAP32_CHK(&m->n_cd_tree);
    FREAD_SWAP32_CHK(&m->sil);

    /* CI names are first in the file. */
    m->ciname = ckd_calloc(m->n_ciphone, sizeof(*m->ciname));

    /* Decide whether to read in the whole file or mmap it. */
    do_mmap = config ? ps_config_bool(config, "mmap") : TRUE;
    if (swap) {
        E_WARN("-mmap specified, but mdef is other-endian.  Will not memory-map.\n");
        do_mmap = FALSE;
    } 
    /* Actually try to mmap it. */
    if (do_mmap) {
        m->filemap = mmio_file_read(filename);
        if (m->filemap == NULL)
            do_mmap = FALSE;
    }
    pos = ftell(fh);
    if (do_mmap) {
        /* Get the base pointer from the memory map. */
        m->ciname[0] = (char *)mmio_file_ptr(m->filemap) + pos;
        /* Success! */
        m->alloc_mode = BIN_MDEF_ON_DISK;
    }
    else {
        /* Read everything into memory. */
        m->alloc_mode = BIN_MDEF_IN_MEMORY;
        fseek(fh, 0, SEEK_END);
        end = ftell(fh);
        fseek(fh, pos, SEEK_SET);
        m->ciname[0] = ckd_malloc(end - pos);
        if (fread(m->ciname[0], 1, end - pos, fh) != (size_t)(end - pos))
            E_FATAL("Failed to read %d bytes of data from %s\n", end - pos, filename);
    }

    for (i = 1; i < m->n_ciphone; ++i)
        m->ciname[i] = m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1;

    /* Skip past the padding. */
    tree_start =
        m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1 - m->ciname[0];
    tree_start = (tree_start + 3) & ~3;
    m->cd_tree = (cd_tree_t *) (m->ciname[0] + tree_start);
    if (swap) {
        for (i = 0; i < m->n_cd_tree; ++i) {
            SWAP_INT16(&m->cd_tree[i].ctx);
            SWAP_INT16(&m->cd_tree[i].n_down);
            SWAP_INT32(&m->cd_tree[i].c.down);
        }
    }
    m->phone = (mdef_entry_t *) (m->cd_tree + m->n_cd_tree);
    if (swap) {
        for (i = 0; i < m->n_phone; ++i) {
            SWAP_INT32(&m->phone[i].ssid);
            SWAP_INT32(&m->phone[i].tmat);
        }
    }
    sseq_size = (int32 *) (m->phone + m->n_phone);
    if (swap)
        SWAP_INT32(sseq_size);
    m->sseq = ckd_calloc(m->n_sseq, sizeof(*m->sseq));
    m->sseq[0] = (uint16 *) (sseq_size + 1);
    if (swap) {
        for (i = 0; i < *sseq_size; ++i)
            SWAP_INT16(m->sseq[0] + i);
    }
    if (m->n_emit_state) {
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[0] + i * m->n_emit_state;
    }
    else {
        m->sseq_len = (uint8 *) (m->sseq[0] + *sseq_size);
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[i - 1] + m->sseq_len[i - 1];
    }

    /* Now build the CD-to-CI mappings using the senone sequences.
     * This is the only really accurate way to do it, though it is
     * still inaccurate in the case of heterogeneous topologies or
     * cross-state tying. */
    m->cd2cisen = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->cd2cisen));
    m->sen2cimap = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->sen2cimap));

    /* Default mappings (identity, none) */
    for (i = 0; i < m->n_ci_sen; ++i)
        m->cd2cisen[i] = i;
    for (; i < m->n_sen; ++i)
        m->cd2cisen[i] = -1;
    for (i = 0; i < m->n_sen; ++i)
        m->sen2cimap[i] = -1;
    for (i = 0; i < m->n_phone; ++i) {
        int32 j, ssid = m->phone[i].ssid;

        for (j = 0; j < bin_mdef_n_emit_state_phone(m, i); ++j) {
            int s = bin_mdef_sseq2sen(m, ssid, j);
            int ci = bin_mdef_pid2ci(m, i);
            /* Take the first one and warn if we have cross-state tying. */
            if (m->sen2cimap[s] == -1)
                m->sen2cimap[s] = ci;
            if (m->sen2cimap[s] != ci)
                E_WARN
                    ("Senone %d is shared between multiple base phones\n",
                     s);

            if (j > bin_mdef_n_emit_state_phone(m, ci))
                E_WARN("CD phone %d has fewer states than CI phone %d\n",
                       i, ci);
            else
                m->cd2cisen[s] =
                    bin_mdef_sseq2sen(m, m->phone[ci].ssid, j);
        }
    }

    /* Set the silence phone. */
    m->sil = bin_mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    E_INFO
        ("%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
         m->n_ciphone, m->n_phone - m->n_ciphone, m->n_emit_state,
         m->n_ci_sen, m->n_sen, m->n_sseq);
    fclose(fh);
    return m;
}